

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O2

uint64_t aom_sum_sse_2d_i16_4xn_sse2(int16_t *src,int stride,int height,int *sum)

{
  uint64_t uVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  uint64_t uVar4;
  int curr_sum;
  int local_40;
  int local_3c;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,stride);
  iVar3 = *sum;
  iVar2 = 0;
  uVar4 = 0;
  local_3c = height;
  do {
    local_40 = 0;
    uVar1 = aom_sum_sse_2d_i16_4x4_sse2(src,(int)local_38,&local_40);
    uVar4 = uVar4 + uVar1;
    iVar3 = iVar3 + local_40;
    *sum = iVar3;
    iVar2 = iVar2 + 4;
    src = src + stride * 4;
  } while (iVar2 < local_3c);
  return uVar4;
}

Assistant:

uint64_t aom_sum_sse_2d_i16_4xn_sse2(const int16_t *src, int stride, int height,
                                     int *sum) {
  int r = 0;
  uint64_t sse = 0;
  do {
    int curr_sum = 0;
    sse += aom_sum_sse_2d_i16_4x4_sse2(src, stride, &curr_sum);
    *sum += curr_sum;
    src += stride << 2;
    r += 4;
  } while (r < height);
  return sse;
}